

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObjFileShape.cpp
# Opt level: O3

void __thiscall chrono::ChObjFileShape::ArchiveIN(ChObjFileShape *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChObjFileShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  (**(code **)(*(long *)marchive + 0x40))(marchive);
  return;
}

Assistant:

void ChObjFileShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChObjFileShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(filename);
}